

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# KBO.cpp
# Opt level: O2

void __thiscall Kernel::KBO::State::recordVariable<_1>(State *this,uint var)

{
  int iVar1;
  int iVar2;
  int *pnum;
  int local_1c;
  int *local_18;
  
  local_1c = 0;
  Lib::DHMap<unsigned_int,_int,_Lib::IdentityHash,_Lib::DefaultHash>::getValuePtr
            (&this->_varDiffs,var,&local_18,&local_1c);
  iVar1 = *local_18;
  iVar2 = iVar1 + -1;
  *local_18 = iVar2;
  if (iVar2 == 0) {
    this->_posNum = this->_posNum + -1;
  }
  else if (iVar1 == 0) {
    this->_negNum = this->_negNum + 1;
  }
  return;
}

Assistant:

void KBO::State::recordVariable(unsigned var)
{
  static_assert(coef==1 || coef==-1);

  int* pnum;
  _varDiffs.getValuePtr(var,pnum,0);
  (*pnum)+=coef;
  if constexpr (coef==1) {
    if(*pnum==0) {
      _negNum--;
    } else if(*pnum==1) {
      _posNum++;
    }
  } else {
    if(*pnum==0) {
      _posNum--;
    } else if(*pnum==-1) {
      _negNum++;
    }
  }
}